

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

PointLight * __thiscall
embree::SceneGraph::PointLight::transform(PointLight *this,AffineSpace3fa *space)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined8 uVar20;
  PointLight *in_RDI;
  
  fVar1 = (this->P).field_0.m128[0];
  fVar2 = (this->P).field_0.m128[1];
  fVar3 = (this->P).field_0.m128[2];
  fVar4 = (space->l).vz.field_0.m128[0];
  fVar5 = (space->l).vz.field_0.m128[1];
  fVar6 = (space->l).vz.field_0.m128[2];
  fVar7 = (space->l).vz.field_0.m128[3];
  fVar8 = (space->p).field_0.m128[0];
  fVar9 = (space->p).field_0.m128[1];
  fVar10 = (space->p).field_0.m128[2];
  fVar11 = (space->p).field_0.m128[3];
  fVar12 = (space->l).vy.field_0.m128[0];
  fVar13 = (space->l).vy.field_0.m128[1];
  fVar14 = (space->l).vy.field_0.m128[2];
  fVar15 = (space->l).vy.field_0.m128[3];
  fVar16 = (space->l).vx.field_0.m128[0];
  fVar17 = (space->l).vx.field_0.m128[1];
  fVar18 = (space->l).vx.field_0.m128[2];
  fVar19 = (space->l).vx.field_0.m128[3];
  (in_RDI->super_Light).type = LIGHT_POINT;
  (in_RDI->P).field_0.m128[0] = fVar1 * fVar16 + fVar2 * fVar12 + fVar3 * fVar4 + fVar8;
  (in_RDI->P).field_0.m128[1] = fVar1 * fVar17 + fVar2 * fVar13 + fVar3 * fVar5 + fVar9;
  (in_RDI->P).field_0.m128[2] = fVar1 * fVar18 + fVar2 * fVar14 + fVar3 * fVar6 + fVar10;
  (in_RDI->P).field_0.m128[3] = fVar1 * fVar19 + fVar2 * fVar15 + fVar3 * fVar7 + fVar11;
  uVar20 = *(undefined8 *)((long)&(this->I).field_0 + 8);
  *(undefined8 *)&(in_RDI->I).field_0 = *(undefined8 *)&(this->I).field_0;
  *(undefined8 *)((long)&(in_RDI->I).field_0 + 8) = uVar20;
  return in_RDI;
}

Assistant:

PointLight transform(const AffineSpace3fa& space) const {
        return PointLight(xfmPoint(space,P),I);
      }